

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::CopyStaticResources
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IPipelineResourceSignature *pDstSignature)

{
  bool bVar1;
  string msg;
  char (*in_stack_ffffffffffffffc8) [3];
  string local_30;
  
  if (pDstSignature == (IPipelineResourceSignature *)0x0) {
    FormatString<char[39]>(&local_30,(char (*) [39])"Destination signature must not be null");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"CopyStaticResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x23d);
  }
  else if ((PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)pDstSignature == this) {
    FormatString<char[52]>
              (&local_30,(char (*) [52])"Source and destination signatures must be different");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"CopyStaticResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x243);
  }
  else {
    bVar1 = IsCompatibleWith((PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)
                             pDstSignature,(IPipelineResourceSignature *)this);
    if (bVar1) {
      PipelineResourceSignatureGLImpl::CopyStaticResources
                ((PipelineResourceSignatureGLImpl *)this,
                 (ShaderResourceCacheGL *)
                 pDstSignature[0x11].super_IDeviceObject.super_IObject._vptr_IObject);
      return;
    }
    FormatString<char[71],char_const*,char[48],char_const*,char[3]>
              (&local_30,
               (Diligent *)
               "Can\'t copy static resources: destination pipeline resource signature \'",
               (char (*) [71])(pDstSignature + 3),
               (char **)"\' is not compatible with the source signature \'",
               (char (*) [48])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",in_stack_ffffffffffffffc8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_30._M_dataplus._M_p,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CopyStaticResources(IPipelineResourceSignature* pDstSignature) const override final
    {
        if (pDstSignature == nullptr)
        {
            DEV_ERROR("Destination signature must not be null");
            return;
        }

        if (pDstSignature == this)
        {
            DEV_ERROR("Source and destination signatures must be different");
            return;
        }

        const PipelineResourceSignatureImplType* const pThisImpl    = static_cast<const PipelineResourceSignatureImplType*>(this);
        const PipelineResourceSignatureImplType* const pDstSignImpl = static_cast<const PipelineResourceSignatureImplType*>(pDstSignature);
        if (!pDstSignImpl->IsCompatibleWith(pThisImpl))
        {
            LOG_ERROR_MESSAGE("Can't copy static resources: destination pipeline resource signature '", pDstSignImpl->m_Desc.Name,
                              "' is not compatible with the source signature '", pThisImpl->m_Desc.Name, "'.");
            return;
        }

        pThisImpl->CopyStaticResources(*pDstSignImpl->m_pStaticResCache);
    }